

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_command.cpp
# Opt level: O0

void __thiscall duckdb::LoopCommand::ExecuteInternal(LoopCommand *this,ExecuteContext *context)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  bool bVar1;
  uint uVar2;
  pointer pCVar3;
  runtime_error *prVar4;
  ulong uVar5;
  char *_file;
  long in_RSI;
  long in_RDI;
  unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true> *statement;
  const_iterator __end3;
  const_iterator __begin3;
  vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_true>
  *__range3;
  bool finished;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  ParallelExecuteContext *context_2;
  iterator __end2_4;
  iterator __begin2_4;
  list<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_> *__range2_4;
  thread *thread;
  iterator __end2_3;
  iterator __begin2_3;
  list<std::thread,_std::allocator<std::thread>_> *__range2_3;
  ParallelExecuteContext *context_1;
  iterator __end2_2;
  iterator __begin2_2;
  list<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_> *__range2_2;
  list<std::thread,_std::allocator<std::thread>_> threads;
  list<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_> contexts;
  unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true> *command;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_true>
  *__range2_1;
  LoopDefinition *running_loop;
  iterator __end2;
  iterator __begin2;
  vector<duckdb::LoopDefinition,_true> *__range2;
  LoopDefinition loop_def;
  pointer in_stack_fffffffffffffc88;
  undefined7 in_stack_fffffffffffffc90;
  byte in_stack_fffffffffffffc97;
  LoopDefinition *in_stack_fffffffffffffc98;
  LoopDefinition *in_stack_fffffffffffffca0;
  SQLLogicTestRunner *in_stack_fffffffffffffca8;
  SourceLineInfo *in_stack_fffffffffffffcb0;
  ExecuteContext *in_stack_fffffffffffffce8;
  Command *in_stack_fffffffffffffcf0;
  __normal_iterator<const_duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>_>
  local_2f0;
  long local_2e8;
  byte local_2de;
  undefined4 local_2dc;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  string local_2b8 [32];
  undefined1 local_298 [48];
  StringRef local_268;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  string local_1e8 [48];
  StringRef local_1b8;
  SourceLineInfo local_1a8;
  StringRef local_198;
  reference local_140;
  _Self local_138;
  _Self local_130;
  undefined1 *local_128;
  reference local_120;
  _Self local_118;
  _Self local_110;
  undefined1 *local_108;
  reference local_100;
  reference local_f8;
  _Self local_f0;
  _Self local_e8;
  undefined1 *local_e0;
  undefined1 local_d8 [24];
  undefined1 local_c0 [24];
  reference local_a8;
  unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true> *local_a0;
  __normal_iterator<const_duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>_>
  local_98;
  long local_90;
  reference local_78;
  LoopDefinition *local_70;
  __normal_iterator<duckdb::LoopDefinition_*,_std::vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>_>
  local_68;
  long local_60;
  int local_38;
  int local_30;
  byte local_2c;
  long local_10;
  
  local_10 = in_RSI;
  LoopDefinition::LoopDefinition(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  local_38 = *(int *)(in_RDI + 0xb4);
  if ((local_2c & 1) == 0) {
    local_2de = 0;
    do {
      in_stack_fffffffffffffc97 = 0;
      if ((local_2de & 1) == 0) {
        bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffc98);
        in_stack_fffffffffffffc97 = bVar1 ^ 0xff;
      }
      if ((in_stack_fffffffffffffc97 & 1) == 0) break;
      std::vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>::push_back
                ((vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_> *)
                 in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
      local_2e8 = in_RDI + 0xd8;
      local_2f0._M_current =
           (unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true> *)
           std::
           vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
           ::begin((vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
                    *)in_stack_fffffffffffffc88);
      std::
      vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
      ::end((vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
             *)in_stack_fffffffffffffc88);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                                (__normal_iterator<const_duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>_>
                                 *)in_stack_fffffffffffffc88), bVar1) {
        __gnu_cxx::
        __normal_iterator<const_duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>_>
        ::operator*(&local_2f0);
        in_stack_fffffffffffffc88 =
             unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>::operator->
                       ((unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true> *)
                        CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
        Command::Execute(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        __gnu_cxx::
        __normal_iterator<const_duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>_>
        ::operator++(&local_2f0);
      }
      std::vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>::pop_back
                ((vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_> *)0x7bc596
                );
      local_38 = local_38 + 1;
    } while (local_38 < local_30);
  }
  else {
    local_60 = local_10 + 8;
    local_68._M_current =
         (LoopDefinition *)
         std::vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>::begin
                   ((vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_> *)
                    in_stack_fffffffffffffc88);
    local_70 = (LoopDefinition *)
               std::vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>::end
                         ((vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_> *
                          )in_stack_fffffffffffffc88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::LoopDefinition_*,_std::vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>_>
                               *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                              (__normal_iterator<duckdb::LoopDefinition_*,_std::vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>_>
                               *)in_stack_fffffffffffffc88), bVar1) {
      local_78 = __gnu_cxx::
                 __normal_iterator<duckdb::LoopDefinition_*,_std::vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>_>
                 ::operator*(&local_68);
      if ((local_78->is_parallel & 1U) != 0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Nested parallel loop commands not allowed");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      __gnu_cxx::
      __normal_iterator<duckdb::LoopDefinition_*,_std::vector<duckdb::LoopDefinition,_std::allocator<duckdb::LoopDefinition>_>_>
      ::operator++(&local_68);
    }
    local_90 = in_RDI + 0xd8;
    local_98._M_current =
         (unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true> *)
         std::
         vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
         ::begin((vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
                  *)in_stack_fffffffffffffc88);
    local_a0 = (unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true> *)
               std::
               vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
               ::end((vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>
                      *)in_stack_fffffffffffffc88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                              (__normal_iterator<const_duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>_>
                               *)in_stack_fffffffffffffc88), bVar1) {
      local_a8 = __gnu_cxx::
                 __normal_iterator<const_duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>_>
                 ::operator*(&local_98);
      pCVar3 = unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>::operator->
                         ((unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true> *
                          )CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
      uVar2 = (*pCVar3->_vptr_Command[3])();
      if ((uVar2 & 1) == 0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar4,"Concurrent loop is not supported over this command");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      __gnu_cxx::
      __normal_iterator<const_duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>_>_>_>
      ::operator++(&local_98);
    }
    std::__cxx11::
    list<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>::list
              ((list<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>
                *)0x7bbe1d);
    do {
      std::__cxx11::
      list<duckdb::ParallelExecuteContext,std::allocator<duckdb::ParallelExecuteContext>>::
      emplace_back<duckdb::SQLLogicTestRunner&,duckdb::vector<duckdb::unique_ptr<duckdb::Command,std::default_delete<duckdb::Command>,true>,true>const&,duckdb::LoopDefinition&>
                ((list<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>
                  *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                 (vector<duckdb::unique_ptr<duckdb::Command,_std::default_delete<duckdb::Command>,_true>,_true>
                  *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
      local_38 = local_38 + 1;
    } while (local_38 < local_30);
    std::__cxx11::list<std::thread,_std::allocator<std::thread>_>::list
              ((list<std::thread,_std::allocator<std::thread>_> *)0x7bbe91);
    local_e0 = local_c0;
    local_e8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>::
         begin((list<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>
                *)in_stack_fffffffffffffc88);
    local_f0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>::end
                   ((list<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>
                     *)in_stack_fffffffffffffc88);
    while (bVar1 = std::operator!=(&local_e8,&local_f0), bVar1) {
      local_100 = std::_List_iterator<duckdb::ParallelExecuteContext>::operator*
                            ((_List_iterator<duckdb::ParallelExecuteContext> *)0x7bbef3);
      local_f8 = local_100;
      std::__cxx11::list<std::thread,std::allocator<std::thread>>::
      emplace_back<void(&)(duckdb::ParallelExecuteContext*),duckdb::ParallelExecuteContext*>
                ((list<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffca0,
                 (_func_void_ParallelExecuteContext_ptr *)in_stack_fffffffffffffc98,
                 (ParallelExecuteContext **)
                 CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
      std::_List_iterator<duckdb::ParallelExecuteContext>::operator++(&local_e8);
    }
    local_108 = local_d8;
    local_110._M_node =
         (_List_node_base *)
         std::__cxx11::list<std::thread,_std::allocator<std::thread>_>::begin
                   ((list<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffc88);
    local_118._M_node =
         (_List_node_base *)
         std::__cxx11::list<std::thread,_std::allocator<std::thread>_>::end
                   ((list<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffc88);
    while (bVar1 = std::operator!=(&local_110,&local_118), bVar1) {
      local_120 = std::_List_iterator<std::thread>::operator*
                            ((_List_iterator<std::thread> *)0x7bbfb5);
      std::thread::join();
      std::_List_iterator<std::thread>::operator++(&local_110);
    }
    local_128 = local_c0;
    local_130._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>::
         begin((list<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>
                *)in_stack_fffffffffffffc88);
    local_138._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>::end
                   ((list<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>
                     *)in_stack_fffffffffffffc88);
    while (bVar1 = std::operator!=(&local_130,&local_138), bVar1) {
      local_140 = std::_List_iterator<duckdb::ParallelExecuteContext>::operator*
                            ((_List_iterator<duckdb::ParallelExecuteContext> *)0x7bc042);
      bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffc98);
      if (!bVar1) {
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          local_198 = operator____catch_sr
                                ((char *)CONCAT17(in_stack_fffffffffffffc97,
                                                  in_stack_fffffffffffffc90),
                                 (size_t)in_stack_fffffffffffffc88);
          Catch::SourceLineInfo::SourceLineInfo
                    (&local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/sqlite/sqllogic_command.cpp"
                     ,0x13e);
          local_1b8.m_start = (char *)0x0;
          local_1b8.m_size = 0;
          Catch::StringRef::StringRef(&local_1b8);
          capturedExpression.m_size = (size_type)in_stack_fffffffffffffcb0;
          capturedExpression.m_start = (char *)in_stack_fffffffffffffca8;
          Catch::AssertionHandler::AssertionHandler
                    ((AssertionHandler *)in_stack_fffffffffffffca0,
                     (StringRef *)in_stack_fffffffffffffc98,
                     (SourceLineInfo *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90)
                     ,capturedExpression,(Flags)((ulong)in_stack_fffffffffffffc88 >> 0x20));
          local_208 = 0;
          uStack_200 = 0;
          local_1f8 = 0;
          Catch::MessageStream::MessageStream((MessageStream *)0x7bc12b);
          Catch::operator+(&local_140->error_message);
          Catch::MessageStream::operator<<
                    ((MessageStream *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc88);
          Catch::ReusableStringStream::str_abi_cxx11_
                    ((ReusableStringStream *)in_stack_fffffffffffffc88);
          Catch::StringRef::StringRef
                    ((StringRef *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                     (string *)in_stack_fffffffffffffc88);
          Catch::AssertionHandler::handleMessage
                    ((AssertionHandler *)
                     CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                     (OfType)((ulong)in_stack_fffffffffffffc88 >> 0x20),(StringRef *)0x7bc1a3);
          std::__cxx11::string::~string(local_1e8);
          Catch::MessageStream::~MessageStream((MessageStream *)0x7bc1bf);
          Catch::AssertionHandler::complete
                    ((AssertionHandler *)
                     CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
          Catch::AssertionHandler::~AssertionHandler
                    ((AssertionHandler *)
                     CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
        }
        else {
          local_268 = operator____catch_sr
                                ((char *)CONCAT17(in_stack_fffffffffffffc97,
                                                  in_stack_fffffffffffffc90),
                                 (size_t)in_stack_fffffffffffffc88);
          _file = (char *)std::__cxx11::string::c_str();
          in_stack_fffffffffffffcb0 = (SourceLineInfo *)(local_298 + 0x20);
          Catch::SourceLineInfo::SourceLineInfo
                    (in_stack_fffffffffffffcb0,_file,(long)local_140->error_line);
          local_298._16_8_ = 0;
          local_298._24_8_ = 0;
          Catch::StringRef::StringRef((StringRef *)(local_298 + 0x10));
          capturedExpression_00.m_size = (size_type)in_stack_fffffffffffffcb0;
          capturedExpression_00.m_start = (char *)in_stack_fffffffffffffca8;
          Catch::AssertionHandler::AssertionHandler
                    ((AssertionHandler *)in_stack_fffffffffffffca0,
                     (StringRef *)in_stack_fffffffffffffc98,
                     (SourceLineInfo *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90)
                     ,capturedExpression_00,(Flags)((ulong)in_stack_fffffffffffffc88 >> 0x20));
          local_2d8 = 0;
          uStack_2d0 = 0;
          local_2c8 = 0;
          Catch::MessageStream::MessageStream((MessageStream *)0x7bc314);
          local_2dc = 0;
          in_stack_fffffffffffffca8 = (SQLLogicTestRunner *)Catch::operator+(&local_2dc);
          in_stack_fffffffffffffca0 =
               (LoopDefinition *)
               Catch::MessageStream::operator<<
                         ((MessageStream *)
                          CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                          (int *)in_stack_fffffffffffffc88);
          Catch::ReusableStringStream::str_abi_cxx11_
                    ((ReusableStringStream *)in_stack_fffffffffffffc88);
          in_stack_fffffffffffffc98 = (LoopDefinition *)local_298;
          Catch::StringRef::StringRef
                    ((StringRef *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                     (string *)in_stack_fffffffffffffc88);
          Catch::AssertionHandler::handleMessage
                    ((AssertionHandler *)
                     CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                     (OfType)((ulong)in_stack_fffffffffffffc88 >> 0x20),(StringRef *)0x7bc393);
          std::__cxx11::string::~string(local_2b8);
          Catch::MessageStream::~MessageStream((MessageStream *)0x7bc3af);
          Catch::AssertionHandler::complete
                    ((AssertionHandler *)
                     CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
          Catch::AssertionHandler::~AssertionHandler
                    ((AssertionHandler *)
                     CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
        }
      }
      std::_List_iterator<duckdb::ParallelExecuteContext>::operator++(&local_130);
    }
    std::__cxx11::list<std::thread,_std::allocator<std::thread>_>::~list
              ((list<std::thread,_std::allocator<std::thread>_> *)0x7bc45b);
    std::__cxx11::
    list<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>::~list
              ((list<duckdb::ParallelExecuteContext,_std::allocator<duckdb::ParallelExecuteContext>_>
                *)0x7bc468);
  }
  LoopDefinition::~LoopDefinition
            ((LoopDefinition *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
  return;
}

Assistant:

void LoopCommand::ExecuteInternal(ExecuteContext &context) const {
	LoopDefinition loop_def = definition;
	loop_def.loop_idx = definition.loop_start;
	if (loop_def.is_parallel) {
		for (auto &running_loop : context.running_loops) {
			if (running_loop.is_parallel) {
				throw std::runtime_error("Nested parallel loop commands not allowed");
			}
		}
		for (auto &command : loop_commands) {
			if (!command->SupportsConcurrent()) {
				throw std::runtime_error("Concurrent loop is not supported over this command");
			}
		}
		// parallel loop: launch threads
		std::list<ParallelExecuteContext> contexts;
		while (true) {
			contexts.emplace_back(runner, loop_commands, loop_def);
			loop_def.loop_idx++;
			if (loop_def.loop_idx >= loop_def.loop_end) {
				// finished
				break;
			}
		}
		std::list<std::thread> threads;
		for (auto &context : contexts) {
			threads.emplace_back(ParallelExecuteLoop, &context);
		}
		for (auto &thread : threads) {
			thread.join();
		}
		for (auto &context : contexts) {
			if (!context.success) {
				if (!context.error_message.empty()) {
					FAIL(context.error_message);
				} else {
					FAIL_LINE(context.error_file, context.error_line, 0);
				}
			}
		}
	} else {
		bool finished = false;
		while (!finished && !runner.finished_processing_file) {
			// execute the current iteration of the loop
			context.running_loops.push_back(loop_def);
			for (auto &statement : loop_commands) {
				statement->Execute(context);
			}
			context.running_loops.pop_back();
			loop_def.loop_idx++;
			if (loop_def.loop_idx >= loop_def.loop_end) {
				// finished
				break;
			}
		}
	}
}